

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_units_type(element_t *element,int id,units_type_t *units_type)

{
  _Bool _Var1;
  char *end_00;
  char *end;
  char *it;
  string_t *value;
  units_type_t *units_type_local;
  element_t *peStack_18;
  int id_local;
  element_t *element_local;
  
  value = (string_t *)units_type;
  units_type_local._4_4_ = id;
  peStack_18 = element;
  it = (char *)find_attribute(element,id,false);
  if ((string_t *)it == (string_t *)0x0) {
    element_local._7_1_ = false;
  }
  else {
    end = ((string_t *)it)->data;
    end_00 = end + ((string_t *)it)->length;
    _Var1 = skip_string(&end,end_00,"objectBoundingBox");
    if (_Var1) {
      *(undefined4 *)&value->data = 0;
    }
    else {
      _Var1 = skip_string(&end,end_00,"userSpaceOnUse");
      if (_Var1) {
        *(undefined4 *)&value->data = 1;
      }
    }
    _Var1 = skip_ws(&end,end_00);
    element_local._7_1_ = (_Bool)((_Var1 ^ 0xffU) & 1);
  }
  return element_local._7_1_;
}

Assistant:

static bool parse_units_type(const element_t* element, int id, units_type_t* units_type)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "objectBoundingBox"))
        *units_type = units_type_object_bounding_box;
    else if(skip_string(&it, end, "userSpaceOnUse"))
        *units_type = units_type_user_space_on_use;
    return !skip_ws(&it, end);
}